

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZTransform<double>,_20>::TPZManVector
          (TPZManVector<TPZTransform<double>,_20> *this,int64_t size)

{
  undefined1 auVar1 [16];
  int64_t *piVar2;
  int64_t iVar3;
  TPZTransform<double> *pTVar4;
  ulong uVar5;
  long lVar6;
  TPZTransform<double> *pTVar7;
  
  (this->super_TPZVec<TPZTransform<double>_>).fStore = (TPZTransform<double> *)0x0;
  (this->super_TPZVec<TPZTransform<double>_>).fNElements = 0;
  (this->super_TPZVec<TPZTransform<double>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZTransform<double>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01819000;
  pTVar4 = this->fExtAlloc;
  lVar6 = 0;
  pTVar7 = pTVar4;
  do {
    TPZTransform<double>::TPZTransform(pTVar7);
    lVar6 = lVar6 + -0x1a0;
    pTVar7 = pTVar7 + 1;
  } while (lVar6 != -0x2080);
  if (size < 0x15) {
    iVar3 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x1a0),8) == 0) {
      uVar5 = SUB168(auVar1 * ZEXT816(0x1a0),0) | 8;
    }
    piVar2 = (int64_t *)operator_new__(uVar5);
    *piVar2 = size;
    pTVar4 = (TPZTransform<double> *)(piVar2 + 1);
    lVar6 = 0;
    pTVar7 = pTVar4;
    do {
      TPZTransform<double>::TPZTransform(pTVar7);
      lVar6 = lVar6 + -0x1a0;
      pTVar7 = pTVar7 + 1;
      iVar3 = size;
    } while (size * -0x1a0 - lVar6 != 0);
  }
  (this->super_TPZVec<TPZTransform<double>_>).fStore = pTVar4;
  (this->super_TPZVec<TPZTransform<double>_>).fNElements = size;
  (this->super_TPZVec<TPZTransform<double>_>).fNAlloc = iVar3;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}